

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O3

void __thiscall CMU462::Camera::set_screen_size(Camera *this,size_t screenW,size_t screenH)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  
  this->screenW = screenW;
  this->screenH = screenH;
  auVar2._8_4_ = (int)(screenW >> 0x20);
  auVar2._0_8_ = screenW;
  auVar2._12_4_ = 0x45300000;
  dVar1 = (auVar2._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)screenW) - 4503599627370496.0);
  auVar3._8_4_ = (int)(screenH >> 0x20);
  auVar3._0_8_ = screenH;
  auVar3._12_4_ = 0x45300000;
  dVar4 = (auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)screenH) - 4503599627370496.0);
  this->ar = dVar1 / dVar4;
  dVar1 = atan(dVar1 / (this->screenDist + this->screenDist));
  this->hFov = dVar1 * 57.29577951308232 + dVar1 * 57.29577951308232;
  dVar1 = atan(dVar4 / (this->screenDist + this->screenDist));
  this->vFov = dVar1 * 57.29577951308232 + dVar1 * 57.29577951308232;
  return;
}

Assistant:

void Camera::set_screen_size(const size_t screenW, const size_t screenH) {
    this->screenW = screenW;
    this->screenH = screenH;
    ar = 1.0 * screenW / screenH;
    hFov = 2 * degrees(atan(((double) screenW) / (2 * screenDist)));
    vFov = 2 * degrees(atan(((double) screenH) / (2 * screenDist)));
  }